

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  int *piVar1;
  uint uVar2;
  long lVar3;
  Tables *pTVar4;
  string *psVar5;
  int iVar6;
  MessageOptions *pMVar7;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar8;
  ExtensionRangeOptions *pEVar9;
  long *plVar10;
  long *plVar11;
  Type *pTVar12;
  pointer pcVar13;
  OneofOptions *pOVar14;
  size_type *psVar15;
  long lVar16;
  DescriptorBuilder *pDVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  SubstituteArg *in_stack_fffffffffffffd68;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  string local_110;
  RepeatedPtrFieldBase *local_f0;
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8;
  SubstituteArg local_78;
  Type *local_48;
  DescriptorBuilder *local_40;
  DescriptorProto *local_38;
  
  local_40 = this;
  local_38 = proto;
  if (*(long *)(message + 0x20) == 0) {
    pMVar7 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar7;
  }
  if (0 < *(int *)(message + 0x74)) {
    this_00 = &local_38->nested_type_;
    lVar20 = 0;
    lVar18 = 0;
    do {
      lVar16 = *(long *)(message + 0x38);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar18);
      CrossLinkMessage(local_40,(Descriptor *)(lVar16 + lVar20),proto_00);
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x90;
    } while (lVar18 < *(int *)(message + 0x74));
  }
  if (0 < *(int *)(message + 0x78)) {
    this_01 = &local_38->enum_type_;
    lVar20 = 0;
    lVar18 = 0;
    do {
      lVar16 = *(long *)(message + 0x40);
      pDVar17 = (DescriptorBuilder *)this_01;
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,(int)lVar18);
      CrossLinkEnum(pDVar17,(EnumDescriptor *)(lVar16 + lVar20),proto_01);
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x50;
    } while (lVar18 < *(int *)(message + 0x78));
  }
  pDVar17 = local_40;
  if (0 < *(int *)(message + 0x68)) {
    local_48 = (Type *)&local_38->field_;
    lVar20 = 0;
    lVar18 = 0;
    do {
      lVar16 = *(long *)(message + 0x28);
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_48,(int)lVar18);
      CrossLinkField(pDVar17,(FieldDescriptor *)(lVar16 + lVar20),pTVar8);
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x98;
    } while (lVar18 < *(int *)(message + 0x68));
  }
  if (0 < *(int *)(message + 0x80)) {
    local_48 = (Type *)&local_38->extension_;
    lVar20 = 0;
    lVar18 = 0;
    do {
      lVar16 = *(long *)(message + 0x50);
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_48,(int)lVar18);
      CrossLinkField(pDVar17,(FieldDescriptor *)(lVar16 + lVar20),pTVar8);
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x98;
    } while (lVar18 < *(int *)(message + 0x80));
  }
  if (0 < *(int *)(message + 0x7c)) {
    this_02 = &local_38->extension_range_;
    lVar20 = 8;
    lVar18 = 0;
    do {
      lVar16 = *(long *)(message + 0x48);
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                (&this_02->super_RepeatedPtrFieldBase,(int)lVar18);
      if (*(long *)(lVar16 + lVar20) == 0) {
        pEVar9 = ExtensionRangeOptions::default_instance();
        *(ExtensionRangeOptions **)(lVar16 + lVar20) = pEVar9;
      }
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x10;
    } while (lVar18 < *(int *)(message + 0x7c));
  }
  if (0 < *(int *)(message + 0x68)) {
    local_f0 = &(local_38->field_).super_RepeatedPtrFieldBase;
    lVar20 = -0x98;
    lVar18 = 0;
    do {
      plVar11 = *(long **)(*(long *)(message + 0x28) + 0xf0 + lVar20);
      if (plVar11 != (long *)0x0) {
        if ((0 < (int)plVar11[3]) &&
           (*(long **)(*(long *)(message + 0x28) + 0x58 + lVar20) != plVar11)) {
          local_c8[0] = local_b8;
          lVar16 = **(long **)(message + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,lVar16,(*(long **)(message + 8))[1] + lVar16);
          std::__cxx11::string::append((char *)local_c8);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_c8,
                                       **(ulong **)(*(long *)(message + 0x28) + lVar20));
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar15 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_e8.field_2._M_allocated_capacity = *psVar15;
            local_e8.field_2._8_8_ = plVar10[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar15;
            local_e8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_e8._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_48 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                               (local_f0,(int)lVar18 + -1);
          local_a8._M_dataplus._M_p = (pointer)**(undefined8 **)(*(long *)(message + 0x28) + lVar20)
          ;
          local_a8._M_string_length =
               CONCAT44(local_a8._M_string_length._4_4_,
                        *(undefined4 *)(*(undefined8 **)(*(long *)(message + 0x28) + lVar20) + 1));
          local_78.text_ = *(char **)*plVar11;
          local_78.size_ = *(int *)((undefined8 *)*plVar11 + 1);
          local_290.text_ = (char *)0x0;
          local_290.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          local_200.text_ = (char *)0x0;
          local_200.size_ = -1;
          local_1d0.text_ = (char *)0x0;
          local_1d0.size_ = -1;
          local_1a0.text_ = (char *)0x0;
          local_1a0.size_ = -1;
          local_170.text_ = (char *)0x0;
          local_170.size_ = -1;
          local_140.text_ = (char *)0x0;
          local_140.size_ = -1;
          strings::Substitute_abi_cxx11_
                    (&local_110,
                     (strings *)
                     "Fields in the same oneof must be defined consecutively. \"$0\" cannot be defined before the completion of the \"$1\" oneof definition."
                     ,(char *)&local_a8,&local_78,&local_290,&local_260,&local_230,&local_200,
                     &local_1d0,&local_1a0,&local_170,&local_140,in_stack_fffffffffffffd68);
          AddError(local_40,&local_e8,&local_48->super_Message,TYPE,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if (local_c8[0] != local_b8) {
            operator_delete(local_c8[0]);
          }
        }
        piVar1 = (int *)(*(long *)(message + 0x30) + 0x18 +
                        (long)((int)((ulong)((long)plVar11 - *(long *)(plVar11[2] + 0x30)) >> 4) *
                              -0x55555555) * 0x30);
        *piVar1 = *piVar1 + 1;
      }
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x98;
    } while (lVar18 < *(int *)(message + 0x68));
  }
  if (0 < *(int *)(message + 0x6c)) {
    local_48 = (Type *)&local_38->oneof_decl_;
    lVar20 = 0x28;
    lVar18 = 0;
    pDVar17 = local_40;
    do {
      lVar16 = *(long *)(message + 0x30);
      if (*(int *)(lVar16 + -0x10 + lVar20) == 0) {
        local_78.text_ = local_78.scratch_ + 4;
        lVar3 = **(long **)(message + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,lVar3,(*(long **)(message + 8))[1] + lVar3);
        std::__cxx11::string::append((char *)&local_78);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_78,**(ulong **)(lVar16 + -0x28 + lVar20));
        pDVar17 = local_40;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_a8.field_2._M_allocated_capacity = *psVar15;
          local_a8.field_2._8_8_ = plVar11[3];
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar15;
          local_a8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_a8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pTVar12 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_48,(int)lVar18);
        AddError(pDVar17,&local_a8,&pTVar12->super_Message,NAME,
                 "Oneof must have at least one field.");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if (local_78.text_ != local_78.scratch_ + 4) {
          operator_delete(local_78.text_);
        }
      }
      pTVar4 = pDVar17->tables_;
      uVar2 = *(uint *)(lVar16 + -0x10 + lVar20);
      local_a8._M_dataplus._M_p._0_4_ = uVar2 << 3;
      if ((uVar2 & 0x1fffffff) == 0) {
        pcVar13 = (pointer)0x0;
      }
      else {
        std::
        vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
        ::emplace_back<int&>
                  ((vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                    *)&pTVar4->allocations_,(int *)&local_a8);
        pcVar13 = (pTVar4->allocations_).
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      }
      pDVar17 = local_40;
      *(pointer *)(lVar16 + -8 + lVar20) = pcVar13;
      *(undefined4 *)(lVar16 + -0x10 + lVar20) = 0;
      if (*(long *)(lVar16 + lVar20) == 0) {
        pOVar14 = OneofOptions::default_instance();
        *(OneofOptions **)(lVar16 + lVar20) = pOVar14;
      }
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x30;
    } while (lVar18 < *(int *)(message + 0x6c));
  }
  iVar6 = *(int *)(message + 0x68);
  if (0 < (long)iVar6) {
    lVar18 = 0;
    do {
      lVar20 = *(long *)(message + 0x28);
      lVar16 = *(long *)(lVar20 + 0x58 + lVar18);
      if (lVar16 != 0) {
        lVar3 = *(long *)(message + 0x30);
        lVar16 = (long)((int)((ulong)(lVar16 - *(long *)(*(long *)(lVar16 + 0x10) + 0x30)) >> 4) *
                       -0x55555555) * 0x30;
        iVar19 = *(int *)(lVar3 + 0x18 + lVar16);
        *(int *)(lVar20 + 0x48 + lVar18) = iVar19;
        *(int *)(lVar3 + 0x18 + lVar16) = iVar19 + 1;
        *(long *)(*(long *)(lVar3 + 0x20 + lVar16) + (long)iVar19 * 8) = lVar20 + lVar18;
      }
      lVar18 = lVar18 + 0x98;
    } while ((long)iVar6 * 0x98 - lVar18 != 0);
  }
  if (0 < *(int *)(message + 0x68)) {
    this_03 = &local_38->field_;
    lVar20 = 0x58;
    lVar18 = 0;
    do {
      if ((*(char *)(*(long *)(message + 0x28) + -0x17 + lVar20) == '\x01') &&
         (((lVar16 = *(long *)(*(long *)(message + 0x28) + lVar20), lVar16 == 0 ||
           (*(int *)(lVar16 + 0x18) != 1)) || (*(char *)(**(long **)(lVar16 + 0x20) + 0x41) == '\0')
          ))) {
        psVar5 = *(string **)(message + 8);
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&this_03->super_RepeatedPtrFieldBase,(int)lVar18);
        AddError(local_40,psVar5,&pTVar8->super_Message,OTHER,
                 "Fields with proto3_optional set must be a member of a one-field oneof");
      }
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x98;
    } while (lVar18 < *(int *)(message + 0x68));
  }
  iVar6 = *(int *)(message + 0x6c);
  if (iVar6 < 1) {
    iVar19 = -1;
  }
  else {
    local_38 = (DescriptorProto *)&local_38->oneof_decl_;
    iVar19 = -1;
    lVar18 = 0x20;
    lVar20 = 0;
    do {
      if ((*(int *)(*(long *)(message + 0x30) + -8 + lVar18) == 1) &&
         (*(char *)(**(long **)(*(long *)(message + 0x30) + lVar18) + 0x41) == '\x01')) {
        if (iVar19 == -1) {
          iVar19 = (int)lVar20;
        }
      }
      else if (iVar19 == -1) {
        iVar19 = -1;
      }
      else {
        psVar5 = *(string **)(message + 8);
        pTVar12 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_38,(int)lVar20);
        AddError(local_40,psVar5,&pTVar12->super_Message,OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
      lVar20 = lVar20 + 1;
      iVar6 = *(int *)(message + 0x6c);
      lVar18 = lVar18 + 0x30;
    } while (lVar20 < iVar6);
  }
  if (iVar19 != -1) {
    iVar6 = iVar19;
  }
  *(int *)(message + 0x70) = iVar6;
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  if (message->options_ == nullptr) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < message->extension_range_count(); i++) {
    CrossLinkExtensionRange(&message->extension_ranges_[i],
                            proto.extension_range(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(message->full_name() + "." + message->field(i - 1)->name(),
                 proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute(
                     "Fields in the same oneof must be defined consecutively. "
                     "\"$0\" cannot be defined before the completion of the "
                     "\"$1\" oneof definition.",
                     message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ = tables_->AllocateArray<const FieldDescriptor*>(
        oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == nullptr) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    if (oneof->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}